

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

bool __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::InnerMap::TableEntryIsTooLong(InnerMap *this,size_type b)

{
  LogMessage *other;
  LogFinisher local_7d [20];
  byte local_69;
  LogMessage local_68;
  void *local_30;
  Node *node;
  size_type count;
  size_type kMaxLength;
  size_type b_local;
  InnerMap *this_local;
  
  count = 8;
  node = (Node *)0x0;
  local_30 = this->table_[b];
  do {
    node = (Node *)&node->field_0x1;
    local_30 = *(void **)((long)local_30 + 0x40);
  } while (local_30 != (void *)0x0);
  local_69 = 0;
  kMaxLength = b;
  b_local = (size_type)this;
  if ((undefined1 *)0x8 < node) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x3fe);
    local_69 = 1;
    other = internal::LogMessage::operator<<(&local_68,"CHECK failed: (count) <= (kMaxLength): ");
    internal::LogFinisher::operator=(local_7d,other);
  }
  if ((local_69 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_68);
  }
  return (Node *)0x7 < node;
}

Assistant:

bool TableEntryIsTooLong(size_type b) {
      const size_type kMaxLength = 8;
      size_type count = 0;
      Node* node = static_cast<Node*>(table_[b]);
      do {
        ++count;
        node = node->next;
      } while (node != nullptr);
      // Invariant: no linked list ever is more than kMaxLength in length.
      GOOGLE_DCHECK_LE(count, kMaxLength);
      return count >= kMaxLength;
    }